

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O1

void secp256k1_ecmult_const(secp256k1_gej *r,secp256k1_ge *a,secp256k1_scalar *scalar,int size)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  sbyte sVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  secp256k1_ge *psVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  secp256k1_ge *psVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  uint64_t uVar22;
  bool bVar23;
  byte bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar35;
  uint uVar36;
  uint uVar37;
  secp256k1_fe zr [8];
  secp256k1_fe Z;
  secp256k1_ge pre_a [8];
  secp256k1_ge_storage a2_stor;
  int wnaf_1 [65];
  secp256k1_ge correction;
  secp256k1_scalar neg_s;
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [20];
  uint uStack_a34;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined1 auStack_a20 [16];
  undefined1 auStack_a10 [16];
  undefined8 uStack_a00;
  int local_9f8;
  secp256k1_fe local_900;
  secp256k1_ge local_8d8 [8];
  secp256k1_ge_storage local_618;
  secp256k1_ge_storage local_5d8;
  uint auStack_598 [66];
  secp256k1_ge local_490;
  secp256k1_gej local_438 [8];
  
  bVar24 = 0;
  uVar15 = scalar->d[0];
  uVar16 = scalar->d[1];
  uVar1 = scalar->d[2];
  uVar6 = scalar->d[3];
  psVar13 = local_8d8;
  auVar25[0] = -((char)uVar1 == -1);
  auVar25[1] = -((char)(uVar1 >> 8) == -1);
  auVar25[2] = -((char)(uVar1 >> 0x10) == -1);
  auVar25[3] = -((char)(uVar1 >> 0x18) == -1);
  auVar25[4] = -((char)(uVar1 >> 0x20) == -1);
  auVar25[5] = -((char)(uVar1 >> 0x28) == -1);
  auVar25[6] = -((char)(uVar1 >> 0x30) == -1);
  auVar25[7] = -((char)(uVar1 >> 0x38) == -1);
  auVar25[8] = 0xff;
  auVar25[9] = 0xff;
  auVar25[10] = 0xff;
  auVar25[0xb] = 0xff;
  auVar25[0xc] = 0xff;
  auVar25[0xd] = 0xff;
  auVar25[0xe] = 0xff;
  auVar25[0xf] = 0xff;
  uVar12 = (uint)(uVar6 >> 0x3f);
  uVar8 = uVar12 ^ 1;
  uVar11 = 0;
  uVar9 = uVar8;
  if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe | 0x8000) == 0xffff) {
    uVar9 = 0;
  }
  if (0x5d576e7357a4501c < uVar16) {
    uVar8 = 0;
  }
  uVar9 = (uVar8 | uVar6 < 0x7fffffffffffffff | uVar9) ^ 1;
  uVar8 = 0;
  if (0xdfe92f46681b20a0 < uVar15) {
    uVar8 = uVar9;
  }
  if (0x5d576e7357a4501d < uVar16) {
    uVar8 = uVar9;
  }
  uVar8 = uVar8 | uVar12;
  uVar19 = (uint)uVar15 & 1 ^ uVar8;
  local_8d8[0].x.n[0] = uVar15;
  local_8d8[0].x.n[1] = uVar16;
  local_8d8[0].x.n[2] = uVar1;
  local_8d8[0].x.n[3] = uVar6;
  secp256k1_scalar_negate((secp256k1_scalar *)local_438,(secp256k1_scalar *)psVar13);
  uVar18 = (uint)psVar13;
  uVar9 = (uint)((((local_438[0].x.n[0] ^ 1) == 0 && local_438[0].x.n[1] == 0) &&
                 local_438[0].x.n[2] == 0) && local_438[0].x.n[3] == 0) * 0x100 + uVar19;
  uVar12 = uVar9 >> 6;
  sVar7 = (sbyte)uVar19;
  uVar5 = (ulong)(uVar9 < 0x40) << sVar7;
  uVar10 = (ulong)(uVar12 == 1) << sVar7;
  uVar14 = (ulong)(uVar12 == 2) << sVar7;
  local_8d8[0].x.n[0] = uVar5 + uVar15;
  uVar15 = (ulong)CARRY8(uVar5,uVar15);
  uVar5 = uVar10 + uVar16;
  local_8d8[0].x.n[1] = uVar5 + uVar15;
  uVar15 = (ulong)(CARRY8(uVar10,uVar16) || CARRY8(uVar5,uVar15));
  uVar16 = uVar14 + uVar1;
  local_8d8[0].x.n[2] = uVar16 + uVar15;
  local_8d8[0].x.n[3] =
       ((ulong)(uVar12 == 3) << sVar7) + uVar6 +
       (ulong)(CARRY8(uVar14,uVar1) || CARRY8(uVar16,uVar15));
  iVar4 = secp256k1_scalar_cond_negate((secp256k1_scalar *)local_8d8,uVar8);
  iVar20 = -iVar4;
  if ((((local_438[0].x.n[0] ^ 1) != 0 || local_438[0].x.n[1] != 0) || local_438[0].x.n[2] != 0) ||
      local_438[0].x.n[3] != 0) {
    iVar20 = iVar4;
  }
  uVar15 = local_8d8[0].x.n[1] << 0x3c | local_8d8[0].x.n[0] >> 4;
  local_8d8[0].x.n[1] = local_8d8[0].x.n[1] >> 4 | local_8d8[0].x.n[2] << 0x3c;
  local_8d8[0].x.n[2] = local_8d8[0].x.n[2] >> 4 | local_8d8[0].x.n[3] << 0x3c;
  local_8d8[0].x.n[3] = local_8d8[0].x.n[3] >> 4;
  if (0 < size) {
    uVar11 = 0;
    uVar16 = uVar15;
    uVar8 = (uint)local_8d8[0].x.n[0] & 0xf;
    do {
      uVar12 = (uint)uVar16;
      uVar16 = uVar16 >> 4 | local_8d8[0].x.n[1] << 0x3c;
      local_8d8[0].x.n[1] = local_8d8[0].x.n[1] >> 4 | local_8d8[0].x.n[2] << 0x3c;
      local_8d8[0].x.n[2] = local_8d8[0].x.n[2] >> 4 | local_8d8[0].x.n[3] << 0x3c;
      local_8d8[0].x.n[3] = local_8d8[0].x.n[3] >> 4;
      uVar18 = ~uVar12 & 1;
      uVar9 = -uVar18;
      if (0 < (int)uVar8) {
        uVar9 = uVar18;
      }
      uVar18 = (uVar12 & 0xf) + uVar9;
      auStack_598[uVar11] = (uVar8 + uVar9 * -0x10) * iVar20;
      uVar11 = uVar11 + 1;
      uVar8 = uVar18;
    } while ((size - 1U >> 2) + 1 != uVar11);
  }
  auStack_598[uVar11] = uVar18 * iVar20;
  r->infinity = a->infinity;
  uVar22 = (a->x).n[1];
  uVar2 = (a->x).n[2];
  uVar3 = (a->x).n[3];
  (r->x).n[0] = (a->x).n[0];
  (r->x).n[1] = uVar22;
  (r->x).n[2] = uVar2;
  (r->x).n[3] = uVar3;
  (r->x).n[4] = (a->x).n[4];
  uVar22 = (a->y).n[1];
  uVar2 = (a->y).n[2];
  uVar3 = (a->y).n[3];
  (r->y).n[0] = (a->y).n[0];
  (r->y).n[1] = uVar22;
  (r->y).n[2] = uVar2;
  (r->y).n[3] = uVar3;
  (r->y).n[4] = (a->y).n[4];
  (r->z).n[0] = 1;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  local_8d8[0].x.n[0] = uVar15;
  secp256k1_ecmult_odd_multiples_table
            ((int)local_438,(secp256k1_gej *)local_a48,&r->x,(secp256k1_gej *)a);
  secp256k1_ge_globalz_set_table_gej(8,local_8d8,&local_900,local_438,(secp256k1_fe *)local_a48);
  lVar21 = 0x28;
  do {
    secp256k1_fe_normalize_weak((secp256k1_fe *)((long)local_8d8[0].x.n + lVar21));
    lVar21 = lVar21 + 0x58;
  } while (lVar21 != 0x2e8);
  uVar12 = size + 3;
  uVar8 = *(uint *)((long)auStack_598 + (ulong)(uVar12 & 0xfffffffc));
  uVar9 = -uVar8;
  if (uVar8 != uVar9 && SBORROW4(uVar8,uVar9) == (int)(uVar8 * 2) < 0) {
    uVar9 = uVar8;
  }
  lVar21 = 0;
  do {
    uVar18 = (uint)((ulong)(uVar9 >> 1) * 0x58 - lVar21 == 0);
    uVar35 = (int)(uVar18 << 0x1f) >> 0x1f;
    uVar36 = (int)(uVar18 << 0x1f) >> 0x1f;
    uVar37 = (int)(uVar18 << 0x1f) >> 0x1f;
    uVar18 = (int)(uVar18 << 0x1f) >> 0x1f;
    local_a48._0_4_ =
         *(uint *)((long)local_8d8[0].x.n + lVar21) & uVar35 | ~uVar35 & local_a48._0_4_;
    local_a48._4_4_ =
         *(uint *)((long)local_8d8[0].x.n + lVar21 + 4) & uVar36 | ~uVar36 & local_a48._4_4_;
    local_a48._8_4_ =
         *(uint *)((long)local_8d8[0].x.n + lVar21 + 8) & uVar37 | ~uVar37 & local_a48._8_4_;
    local_a48._12_4_ =
         *(uint *)((long)local_8d8[0].x.n + lVar21 + 0xc) & uVar18 | ~uVar18 & local_a48._12_4_;
    local_a48._16_4_ =
         *(uint *)((long)local_8d8[0].x.n + lVar21 + 0x10) & uVar35 | ~uVar35 & local_a48._16_4_;
    uStack_a34 = *(uint *)((long)local_8d8[0].x.n + lVar21 + 0x14) & uVar36 | ~uVar36 & uStack_a34;
    uStack_a30._0_4_ =
         *(uint *)((long)local_8d8[0].x.n + lVar21 + 0x18) & uVar37 | ~uVar37 & (uint)uStack_a30;
    uStack_a30._4_4_ =
         *(uint *)((long)local_8d8[0].x.n + lVar21 + 0x1c) & uVar18 | ~uVar18 & uStack_a30._4_4_;
    local_a28._0_4_ =
         *(uint *)((long)local_8d8[0].x.n + lVar21 + 0x20) & uVar35 | ~uVar35 & (uint)local_a28;
    local_a28._4_4_ =
         *(uint *)((long)local_8d8[0].x.n + lVar21 + 0x24) & uVar36 | ~uVar36 & local_a28._4_4_;
    auStack_a20._0_4_ =
         *(uint *)((long)local_8d8[0].y.n + lVar21) & uVar37 | ~uVar37 & auStack_a20._0_4_;
    auStack_a20._4_4_ =
         *(uint *)((long)local_8d8[0].y.n + lVar21 + 4) & uVar18 | ~uVar18 & auStack_a20._4_4_;
    auStack_a20._8_4_ =
         *(uint *)((long)local_8d8[0].y.n + lVar21 + 8) & uVar35 | ~uVar35 & auStack_a20._8_4_;
    auStack_a20._12_4_ =
         *(uint *)((long)local_8d8[0].y.n + lVar21 + 0xc) & uVar36 | ~uVar36 & auStack_a20._12_4_;
    auStack_a10._0_4_ =
         *(uint *)((long)local_8d8[0].y.n + lVar21 + 0x10) & uVar37 | ~uVar37 & auStack_a10._0_4_;
    auStack_a10._4_4_ =
         *(uint *)((long)local_8d8[0].y.n + lVar21 + 0x14) & uVar18 | ~uVar18 & auStack_a10._4_4_;
    auStack_a10._8_4_ =
         ~uVar35 & auStack_a10._8_4_ | *(uint *)((long)local_8d8[0].y.n + lVar21 + 0x18) & uVar35;
    auStack_a10._12_4_ =
         ~uVar36 & auStack_a10._12_4_ | *(uint *)((long)local_8d8[0].y.n + lVar21 + 0x1c) & uVar36;
    uStack_a00._0_4_ =
         ~uVar37 & (uint)uStack_a00 | *(uint *)((long)local_8d8[0].y.n + lVar21 + 0x20) & uVar37;
    uStack_a00._4_4_ =
         ~uVar18 & uStack_a00._4_4_ | *(uint *)((long)local_8d8[0].y.n + lVar21 + 0x24) & uVar18;
    lVar21 = lVar21 + 0x58;
  } while (lVar21 != 0x2c0);
  local_9f8 = 0;
  uVar15 = (ulong)(uVar8 >> 0x1f) - 1;
  uVar16 = -(ulong)(uVar8 >> 0x1f);
  auVar28._0_8_ = 0x3ffffbfffff0bc - auStack_a20._0_8_;
  auVar28._8_8_ = 0x3ffffffffffffc - auStack_a20._8_8_;
  auVar31._8_4_ = (int)uVar15;
  auVar31._0_8_ = uVar15;
  auVar31._12_4_ = (int)(uVar15 >> 0x20);
  auVar34._8_4_ = (int)uVar16;
  auVar34._0_8_ = uVar16;
  auVar34._12_4_ = (int)(uVar16 >> 0x20);
  local_a98 = auVar28 & auVar34 | auStack_a20 & auVar31;
  auVar29._0_8_ = 0x3ffffffffffffc - auStack_a10._0_8_;
  auVar29._8_8_ = 0x3ffffffffffffc - auStack_a10._8_8_;
  local_a58 = auVar29 & auVar34 | auStack_a10 & auVar31;
  uVar15 = uVar16 & 0x3fffffffffffc - uStack_a00 | uStack_a00 & uVar15;
  r->infinity = 0;
  (r->x).n[4] = local_a28;
  (r->x).n[2] = stack0xfffffffffffff5c8;
  (r->x).n[3] = uStack_a30;
  (r->x).n[0] = local_a48._0_8_;
  (r->x).n[1] = local_a48._8_8_;
  auStack_a20._0_8_ = local_a98._0_8_;
  auStack_a20._8_8_ = local_a98._8_8_;
  auStack_a10._0_8_ = local_a58._0_8_;
  auStack_a10._8_8_ = local_a58._8_8_;
  (r->y).n[2] = auStack_a10._0_8_;
  (r->y).n[3] = auStack_a10._8_8_;
  (r->y).n[4] = uVar15;
  (r->y).n[0] = auStack_a20._0_8_;
  (r->y).n[1] = auStack_a20._8_8_;
  (r->z).n[0] = 1;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  auStack_a20 = local_a98;
  auStack_a10 = local_a58;
  uStack_a00 = uVar15;
  if (3 < uVar12) {
    local_a88._8_8_ = local_a48._8_8_;
    local_a88._0_8_ = local_a48._0_8_;
    local_a68._8_8_ = uStack_a30;
    local_a68._0_8_ = stack0xfffffffffffff5c8;
    uVar16 = (ulong)(uVar12 >> 2);
    uVar22 = local_a28;
    do {
      iVar20 = 4;
      do {
        secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
        iVar20 = iVar20 + -1;
      } while (iVar20 != 0);
      uVar8 = auStack_598[uVar16 - 1];
      uVar9 = -uVar8;
      if (uVar8 != uVar9 && SBORROW4(uVar8,uVar9) == (int)(uVar8 * 2) < 0) {
        uVar9 = uVar8;
      }
      lVar21 = 0;
      do {
        bVar23 = (ulong)(uVar9 >> 1) * 0x58 - lVar21 == 0;
        uVar12 = (uint)bVar23;
        auVar26._0_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
        auVar26._4_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
        auVar26._8_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
        auVar26._12_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
        local_a88 = *(undefined1 (*) [16])((long)local_8d8[0].x.n + lVar21) & auVar26 |
                    ~auVar26 & local_a88;
        local_a68 = *(undefined1 (*) [16])((long)local_8d8[0].x.n + lVar21 + 0x10) & auVar26 |
                    ~auVar26 & local_a68;
        if (bVar23) {
          uVar22 = *(uint64_t *)((long)local_8d8[0].x.n + lVar21 + 0x20);
        }
        local_a58 = *(undefined1 (*) [16])((long)local_8d8[0].y.n + lVar21 + 0x10) & auVar26 |
                    ~auVar26 & local_a58;
        if (bVar23) {
          uVar15 = *(ulong *)((long)local_8d8[0].y.n + lVar21 + 0x20);
        }
        local_a98 = ~auVar26 & local_a98 |
                    *(undefined1 (*) [16])((long)local_8d8[0].y.n + lVar21) & auVar26;
        lVar21 = lVar21 + 0x58;
      } while (lVar21 != 0x2c0);
      local_9f8 = 0;
      auVar27._0_8_ = 0x3ffffffffffffc - local_a58._0_8_;
      auVar27._8_8_ = 0x3ffffffffffffc - local_a58._8_8_;
      auVar30._0_8_ = 0x3ffffbfffff0bc - local_a98._0_8_;
      auVar30._8_8_ = 0x3ffffffffffffc - local_a98._8_8_;
      uVar1 = (ulong)(uVar8 >> 0x1f) - 1;
      uVar6 = -(ulong)(uVar8 >> 0x1f);
      auVar32._8_4_ = (int)uVar1;
      auVar32._0_8_ = uVar1;
      auVar32._12_4_ = (int)(uVar1 >> 0x20);
      auVar33._8_4_ = (int)uVar6;
      auVar33._0_8_ = uVar6;
      auVar33._12_4_ = (int)(uVar6 >> 0x20);
      local_a98 = local_a98 & auVar32 | auVar30 & auVar33;
      local_a58 = local_a58 & auVar32 | auVar27 & auVar33;
      uVar15 = uVar15 & uVar1 | uVar6 & 0x3fffffffffffc - uVar15;
      local_a48._0_16_ = local_a88;
      unique0x10001f02 = local_a68;
      local_a28 = uVar22;
      auStack_a20 = local_a98;
      auStack_a10 = local_a58;
      uStack_a00 = uVar15;
      secp256k1_gej_add_ge(r,r,(secp256k1_ge *)local_a48);
      bVar23 = 1 < (long)uVar16;
      uVar16 = uVar16 - 1;
    } while (bVar23);
  }
  secp256k1_fe_mul(&r->z,&r->z,&local_900);
  psVar13 = a;
  psVar17 = &local_490;
  for (lVar21 = 0xb; lVar21 != 0; lVar21 = lVar21 + -1) {
    (psVar17->x).n[0] = (psVar13->x).n[0];
    psVar13 = (secp256k1_ge *)((long)psVar13 + (ulong)bVar24 * -0x10 + 8);
    psVar17 = (secp256k1_ge *)((long)psVar17 + (ulong)bVar24 * -0x10 + 8);
  }
  local_438[0].infinity = local_490.infinity;
  local_438[0].x.n[0] = (a->x).n[0];
  local_438[0].x.n[1] = (a->x).n[1];
  local_438[0].x.n[2] = (a->x).n[2];
  local_438[0].x.n[3] = (a->x).n[3];
  local_438[0].x.n[4] = (a->x).n[4];
  local_438[0].y.n[4] = (a->y).n[4];
  local_438[0].y.n[0] = (a->y).n[0];
  local_438[0].y.n[1] = (a->y).n[1];
  local_438[0].y.n[2] = (a->y).n[2];
  local_438[0].y.n[3] = (a->y).n[3];
  local_438[0].z.n[0] = 1;
  local_438[0].z.n[3] = 0;
  local_438[0].z.n[4] = 0;
  local_438[0].z.n[1] = 0;
  local_438[0].z.n[2] = 0;
  secp256k1_gej_double_var(local_438,local_438,(secp256k1_fe *)0x0);
  secp256k1_ge_set_gej(&local_490,local_438);
  secp256k1_ge_to_storage(&local_5d8,a);
  secp256k1_ge_to_storage(&local_618,&local_490);
  uVar8 = (uint)(uVar19 == 1);
  uVar9 = (int)(uVar8 << 0x1f) >> 0x1f;
  uVar12 = (int)(uVar8 << 0x1f) >> 0x1f;
  uVar18 = (int)(uVar8 << 0x1f) >> 0x1f;
  uVar8 = (int)(uVar8 << 0x1f) >> 0x1f;
  local_5d8.x.n[0]._0_4_ = (uint)local_618.x.n[0] & uVar9 | ~uVar9 & (uint)local_5d8.x.n[0];
  local_5d8.x.n[0]._4_4_ = local_618.x.n[0]._4_4_ & uVar12 | ~uVar12 & local_5d8.x.n[0]._4_4_;
  local_5d8.x.n[1]._0_4_ = (uint)local_618.x.n[1] & uVar18 | ~uVar18 & (uint)local_5d8.x.n[1];
  local_5d8.x.n[1]._4_4_ = local_618.x.n[1]._4_4_ & uVar8 | ~uVar8 & local_5d8.x.n[1]._4_4_;
  local_5d8.x.n[2]._0_4_ = (uint)local_618.x.n[2] & uVar9 | ~uVar9 & (uint)local_5d8.x.n[2];
  local_5d8.x.n[2]._4_4_ = local_618.x.n[2]._4_4_ & uVar12 | ~uVar12 & local_5d8.x.n[2]._4_4_;
  local_5d8.x.n[3]._0_4_ = (uint)local_618.x.n[3] & uVar18 | ~uVar18 & (uint)local_5d8.x.n[3];
  local_5d8.x.n[3]._4_4_ = local_618.x.n[3]._4_4_ & uVar8 | ~uVar8 & local_5d8.x.n[3]._4_4_;
  local_5d8.y.n[0]._0_4_ = (uint)local_618.y.n[0] & uVar9 | ~uVar9 & (uint)local_5d8.y.n[0];
  local_5d8.y.n[0]._4_4_ = local_618.y.n[0]._4_4_ & uVar12 | ~uVar12 & local_5d8.y.n[0]._4_4_;
  local_5d8.y.n[1]._0_4_ = (uint)local_618.y.n[1] & uVar18 | ~uVar18 & (uint)local_5d8.y.n[1];
  local_5d8.y.n[1]._4_4_ = local_618.y.n[1]._4_4_ & uVar8 | ~uVar8 & local_5d8.y.n[1]._4_4_;
  local_5d8.y.n[2]._0_4_ = uVar9 & (uint)local_618.y.n[2] | ~uVar9 & (uint)local_5d8.y.n[2];
  local_5d8.y.n[2]._4_4_ = uVar12 & local_618.y.n[2]._4_4_ | ~uVar12 & local_5d8.y.n[2]._4_4_;
  local_5d8.y.n[3]._0_4_ = uVar18 & (uint)local_618.y.n[3] | ~uVar18 & (uint)local_5d8.y.n[3];
  local_5d8.y.n[3]._4_4_ = uVar8 & local_618.y.n[3]._4_4_ | ~uVar8 & local_5d8.y.n[3]._4_4_;
  secp256k1_ge_from_storage(&local_490,&local_5d8);
  secp256k1_ge_neg(&local_490,&local_490);
  secp256k1_gej_add_ge(r,r,&local_490);
  return;
}

Assistant:

static void secp256k1_ecmult_const(secp256k1_gej *r, const secp256k1_ge *a, const secp256k1_scalar *scalar, int size) {
    secp256k1_ge pre_a[ECMULT_TABLE_SIZE(WINDOW_A)];
    secp256k1_ge tmpa;
    secp256k1_fe Z;

    int skew_1;
#ifdef USE_ENDOMORPHISM
    secp256k1_ge pre_a_lam[ECMULT_TABLE_SIZE(WINDOW_A)];
    int wnaf_lam[1 + WNAF_SIZE(WINDOW_A - 1)];
    int skew_lam;
    secp256k1_scalar q_1, q_lam;
#endif
    int wnaf_1[1 + WNAF_SIZE(WINDOW_A - 1)];

    int i;
    secp256k1_scalar sc = *scalar;

    /* build wnaf representation for q. */
    int rsize = size;
#ifdef USE_ENDOMORPHISM
    if (size > 128) {
        rsize = 128;
        /* split q into q_1 and q_lam (where q = q_1 + q_lam*lambda, and q_1 and q_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&q_1, &q_lam, &sc);
        skew_1   = secp256k1_wnaf_const(wnaf_1,   q_1,   WINDOW_A - 1, 128);
        skew_lam = secp256k1_wnaf_const(wnaf_lam, q_lam, WINDOW_A - 1, 128);
    } else
#endif
    {
        skew_1   = secp256k1_wnaf_const(wnaf_1, sc, WINDOW_A - 1, size);
#ifdef USE_ENDOMORPHISM
        skew_lam = 0;
#endif
    }

    /* Calculate odd multiples of a.
     * All multiples are brought to the same Z 'denominator', which is stored
     * in Z. Due to secp256k1' isomorphism we can do all operations pretending
     * that the Z coordinate was 1, use affine addition formulae, and correct
     * the Z coordinate of the result once at the end.
     */
    secp256k1_gej_set_ge(r, a);
    secp256k1_ecmult_odd_multiples_table_globalz_windowa(pre_a, &Z, r);
    for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
        secp256k1_fe_normalize_weak(&pre_a[i].y);
    }
#ifdef USE_ENDOMORPHISM
    if (size > 128) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_ge_mul_lambda(&pre_a_lam[i], &pre_a[i]);
        }
    }
#endif

    /* first loop iteration (separated out so we can directly set r, rather
     * than having it start at infinity, get doubled several times, then have
     * its new value added to it) */
    i = wnaf_1[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
    VERIFY_CHECK(i != 0);
    ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, i, WINDOW_A);
    secp256k1_gej_set_ge(r, &tmpa);
#ifdef USE_ENDOMORPHISM
    if (size > 128) {
        i = wnaf_lam[WNAF_SIZE_BITS(rsize, WINDOW_A - 1)];
        VERIFY_CHECK(i != 0);
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, i, WINDOW_A);
        secp256k1_gej_add_ge(r, r, &tmpa);
    }
#endif
    /* remaining loop iterations */
    for (i = WNAF_SIZE_BITS(rsize, WINDOW_A - 1) - 1; i >= 0; i--) {
        int n;
        int j;
        for (j = 0; j < WINDOW_A - 1; ++j) {
            secp256k1_gej_double_nonzero(r, r, NULL);
        }

        n = wnaf_1[i];
        ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a, n, WINDOW_A);
        VERIFY_CHECK(n != 0);
        secp256k1_gej_add_ge(r, r, &tmpa);
#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            n = wnaf_lam[i];
            ECMULT_CONST_TABLE_GET_GE(&tmpa, pre_a_lam, n, WINDOW_A);
            VERIFY_CHECK(n != 0);
            secp256k1_gej_add_ge(r, r, &tmpa);
        }
#endif
    }

    secp256k1_fe_mul(&r->z, &r->z, &Z);

    {
        /* Correct for wNAF skew */
        secp256k1_ge correction = *a;
        secp256k1_ge_storage correction_1_stor;
#ifdef USE_ENDOMORPHISM
        secp256k1_ge_storage correction_lam_stor;
#endif
        secp256k1_ge_storage a2_stor;
        secp256k1_gej tmpj;
        secp256k1_gej_set_ge(&tmpj, &correction);
        secp256k1_gej_double_var(&tmpj, &tmpj, NULL);
        secp256k1_ge_set_gej(&correction, &tmpj);
        secp256k1_ge_to_storage(&correction_1_stor, a);
#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            secp256k1_ge_to_storage(&correction_lam_stor, a);
        }
#endif
        secp256k1_ge_to_storage(&a2_stor, &correction);

        /* For odd numbers this is 2a (so replace it), for even ones a (so no-op) */
        secp256k1_ge_storage_cmov(&correction_1_stor, &a2_stor, skew_1 == 2);
#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            secp256k1_ge_storage_cmov(&correction_lam_stor, &a2_stor, skew_lam == 2);
        }
#endif

        /* Apply the correction */
        secp256k1_ge_from_storage(&correction, &correction_1_stor);
        secp256k1_ge_neg(&correction, &correction);
        secp256k1_gej_add_ge(r, r, &correction);

#ifdef USE_ENDOMORPHISM
        if (size > 128) {
            secp256k1_ge_from_storage(&correction, &correction_lam_stor);
            secp256k1_ge_neg(&correction, &correction);
            secp256k1_ge_mul_lambda(&correction, &correction);
            secp256k1_gej_add_ge(r, r, &correction);
        }
#endif
    }
}